

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
* __thiscall
cs_impl::any::
const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
          (any *this)

{
  bool bVar1;
  undefined8 uVar2;
  error *this_00;
  flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *pfVar3;
  long *in_RDI;
  type_info *in_stack_ffffffffffffff68;
  error *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  type((any *)in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (bVar1) {
    local_3d = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"E0006",&local_29);
    cov::error::error(in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68);
    local_3d = 0;
    __cxa_throw(uVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (*in_RDI == 0) {
    this_00 = (error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"E0005",&local_61);
    cov::error::error(this_00,(string *)in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
  }
  pfVar3 = holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
           ::data(*(holder<phmap::flat_hash_map<cs_impl::any,_cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>_>
                    **)(*in_RDI + 0x10));
  return pfVar3;
}

Assistant:

const T &const_val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}